

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O0

void compute_integral_img_int(uint8_t *gray_image,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  size_t i_2;
  size_t j_1;
  float *iimage_data;
  size_t i_1;
  size_t j;
  size_t i;
  uint32_t row_sum;
  int height;
  int width;
  int data_width;
  uint32_t *iimage_idata;
  integral_image *iimage_local;
  uint8_t *gray_image_local;
  
  pfVar4 = iimage->data;
  iVar1 = iimage->data_width;
  iVar2 = iimage->width;
  iVar3 = iimage->height;
  row_sum = 0;
  for (i = 0; i < (ulong)(long)iVar2; i = i + 1) {
    row_sum = gray_image[i] + row_sum;
    pfVar4[i] = (float)row_sum;
  }
  for (j = 1; j < (ulong)(long)iVar3; j = j + 1) {
    row_sum = 0;
    for (i_1 = 0; i_1 < (ulong)(long)iVar2; i_1 = i_1 + 1) {
      row_sum = gray_image[j * (long)iVar2 + i_1] + row_sum;
      pfVar4[j * (long)iVar1 + i_1] = (float)(row_sum + (int)pfVar4[(j - 1) * (long)iVar1 + i_1]);
    }
  }
  pfVar5 = iimage->data;
  for (j_1 = 0; j_1 < (ulong)(long)iVar3; j_1 = j_1 + 1) {
    for (i_2 = 0; i_2 < (ulong)(long)iVar2; i_2 = i_2 + 1) {
      auVar7 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,pfVar4[j_1 * (long)iVar1 + i_2]);
      fVar6 = auVar7._0_4_ * 0.003921569;
      in_ZMM0 = ZEXT464((uint)fVar6);
      pfVar5[j_1 * (long)iVar1 + i_2] = fVar6;
    }
  }
  return;
}

Assistant:

void compute_integral_img_int(uint8_t *gray_image, struct integral_image *iimage) {

    uint32_t *iimage_idata = (uint32_t *) iimage->data;

    int data_width = iimage->data_width;
    int width = iimage->width;
    int height = iimage->height;

    uint32_t row_sum = 0;

    /* sum up the first row */
    for (size_t i = 0; i < width; ++i) {
        /* previous rows are 0 */
        row_sum += gray_image[i];
        iimage_idata[i] = row_sum;
    }

    /* sum all remaining rows*/
    for (size_t j = 1; j < height; ++j) {
        row_sum = 0;
        for (size_t i = 0; i < width; ++i) {
            row_sum += gray_image[j * width + i];
            /*add sum of current row until current idx to sum of all previous rows until current index */
            iimage_idata[j * data_width + i] = row_sum + iimage_idata[(j - 1) * data_width + i];
        }
    }

    
    float *iimage_data = iimage->data;

    for (size_t j = 0; j < height; ++j) {
        for (size_t i = 0; i < width; ++i) {
            //iimage_data[j * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[j * data_width + i]);
            iimage_data[j * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[j * data_width + i]);
            //iimage_data[j * data_width + i] = ((float) iimage_idata[j * data_width + i]) / 255.0f;
        }
    }
    

}